

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

int count_ncateg_in_col(int *x,size_t n,int ncat,uchar *buffer)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 0;
  memset(buffer,0,(long)ncat);
  if (n != 0) {
    sVar1 = 0;
    do {
      if (-1 < (long)x[sVar1]) {
        buffer[x[sVar1]] = '\x01';
      }
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
  }
  if (0 < ncat) {
    uVar2 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)buffer[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)ncat != uVar2);
  }
  return iVar3;
}

Assistant:

int count_ncateg_in_col(const int x[], const size_t n, const int ncat, unsigned char buffer[])
{
    memset(buffer, 0, ncat*sizeof(char));
    for (size_t ix = 0; ix < n; ix++)
    {
        if (likely(x[ix] >= 0)) buffer[x[ix]] = true;
    }

    int ncat_present = 0;
    for (int cat = 0; cat < ncat; cat++)
        ncat_present += buffer[cat];
    return ncat_present;
}